

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void __thiscall
phmap::priv::
base_checker<phmap::btree_multiset<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::multiset<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
::erase(base_checker<phmap::btree_multiset<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::multiset<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
        *this,iterator begin,iterator end)

{
  int iVar1;
  base_checker<phmap::btree_multiset<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::multiset<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
  *this_00;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  const_iterator __first;
  _Rb_tree_node_base *p_Var4;
  const_iterator __last;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
  *pbVar5;
  long lVar6;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
  *pbVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  _Rb_tree_node_base *p_Var11;
  iterator iVar12;
  iterator _end;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertHelper local_68;
  int local_5c;
  undefined1 local_58 [8];
  int local_50;
  undefined4 uStack_4c;
  base_checker<phmap::btree_multiset<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::multiset<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
  *local_40;
  size_type local_38;
  
  pbVar5 = end.node;
  pbVar7 = begin.node;
  iVar8 = end.position;
  local_38 = (this->tree_).
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_>
             .tree_.size_;
  local_5c = begin.position;
  local_58 = (undefined1  [8])pbVar7;
  local_50 = local_5c;
  local_40 = this;
  if (local_5c == iVar8 && pbVar7 == pbVar5) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    do {
      do {
        lVar6 = lVar6 + 0x100000000;
        btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
        ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
                     *)local_58);
      } while (local_58 != (undefined1  [8])pbVar5);
    } while (local_50 != iVar8);
    lVar6 = lVar6 >> 0x20;
  }
  if (((undefined1  [16])begin & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    p_Var3 = (local_40->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    __last._M_node = &(local_40->checker_)._M_t._M_impl.super__Rb_tree_header._M_header;
    __first._M_node = __last._M_node;
    if (p_Var3 != (_Base_ptr)0x0) {
      iVar1 = ((pair<int,_int> *)(pbVar7 + (long)local_5c * 8 + 0xc))->first;
      do {
        if (((int)p_Var3[1]._M_color < iVar1) ||
           ((lVar9 = 0x10, p_Var2 = p_Var3, (int)p_Var3[1]._M_color <= iVar1 &&
            (*(int *)&p_Var3[1].field_0x4 < *(int *)(pbVar7 + (long)local_5c * 8 + 0x10))))) {
          lVar9 = 0x18;
          p_Var2 = __first._M_node;
        }
        __first._M_node = p_Var2;
        p_Var3 = *(_Base_ptr *)((long)&p_Var3->_M_color + lVar9);
      } while (p_Var3 != (_Base_ptr)0x0);
    }
    iVar12 = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
             ::lower_bound<std::pair<int,int>>
                       ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
                         *)local_40,(pair<int,_int> *)(pbVar7 + (long)local_5c * 8 + 0xc));
    local_58 = (undefined1  [8])iVar12.node;
    local_50 = iVar12.position;
    if (local_50 != local_5c || local_58 != (undefined1  [8])pbVar7) {
      do {
        do {
          __first._M_node = (_Base_ptr)std::_Rb_tree_increment(__first._M_node);
          btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
          ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
                       *)local_58);
        } while (local_58 != (undefined1  [8])pbVar7);
      } while (local_50 != local_5c);
    }
    iVar12 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
             ::end((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
                    *)local_40);
    if (iVar12.node != pbVar5 || iVar12.position != iVar8) {
      if (((undefined1  [16])end & (undefined1  [16])0x7) != (undefined1  [16])0x0)
      goto LAB_0023dbba;
      p_Var4 = (local_40->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var4 != (_Rb_tree_node_base *)0x0) {
        p_Var11 = __last._M_node;
        do {
          if (((int)p_Var4[1]._M_color < *(int *)(pbVar5 + (long)iVar8 * 8 + 0xc)) ||
             ((lVar9 = 0x10, __last._M_node = p_Var4,
              (int)p_Var4[1]._M_color <= *(int *)(pbVar5 + (long)iVar8 * 8 + 0xc) &&
              (*(int *)&p_Var4[1].field_0x4 < *(int *)(pbVar5 + (long)iVar8 * 8 + 0x10))))) {
            lVar9 = 0x18;
            __last._M_node = p_Var11;
          }
          p_Var4 = *(_Rb_tree_node_base **)((long)&p_Var4->_M_color + lVar9);
          p_Var11 = __last._M_node;
        } while (p_Var4 != (_Rb_tree_node_base *)0x0);
      }
    }
    iVar12 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
             ::end((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
                    *)local_40);
    if (iVar12.position != iVar8 || iVar12.node != pbVar5) {
      if (((undefined1  [16])end & (undefined1  [16])0x7) != (undefined1  [16])0x0)
      goto LAB_0023dbba;
      iVar12 = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
               ::lower_bound<std::pair<int,int>>
                         ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
                           *)local_40,(pair<int,_int> *)(pbVar5 + (long)iVar8 * 8 + 0xc));
      local_58 = (undefined1  [8])iVar12.node;
      local_50 = iVar12.position;
      if (local_50 != iVar8 || local_58 != (undefined1  [8])pbVar5) {
        do {
          do {
            __last._M_node = (_Base_ptr)std::_Rb_tree_increment(__last._M_node);
            btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
            ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
                         *)local_58);
          } while (local_58 != (undefined1  [8])pbVar5);
        } while (local_50 != iVar8);
      }
    }
    this_00 = local_40;
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::_M_erase_aux(&(local_40->checker_)._M_t,__first,__last);
    iVar12.position = local_5c;
    iVar12.node = pbVar7;
    iVar12._12_4_ = 0;
    _end._12_4_ = 0;
    _end.node = (btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
                 *)SUB128(end._0_12_,0);
    _end.position = SUB124(end._0_12_,8);
    btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
    ::erase((pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>_>
             *)local_58,
            (btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
             *)this_00,iVar12,_end);
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (this_00->tree_).
         super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_>
         .
         super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_>
         .tree_.size_;
    local_68.data_ =
         (AssertHelperData *)(this_00->checker_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_58,"tree_.size()","checker_.size()",(unsigned_long *)&local_70,
               (unsigned_long *)&local_68);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)CONCAT44(uStack_4c,local_50) == (undefined8 *)0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = *(char **)CONCAT44(uStack_4c,local_50);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x103,pcVar10);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_70._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_4c,local_50) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_4c,local_50));
    }
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (local_40->tree_).
         super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_>
         .
         super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_>
         .tree_.size_;
    local_68.data_ = (AssertHelperData *)(local_38 - lVar6);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_58,"tree_.size()","size - count",(unsigned_long *)&local_70,
               (unsigned_long *)&local_68);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)CONCAT44(uStack_4c,local_50) == (undefined8 *)0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = *(char **)CONCAT44(uStack_4c,local_50);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x104,pcVar10);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_70._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_4c,local_50) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_4c,local_50));
    }
    return;
  }
LAB_0023dbba:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, true>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, true>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
               );
}

Assistant:

void erase(iterator begin, iterator end) {
        size_t size = tree_.size();
        int count = std::distance(begin, end);
        auto checker_begin = checker_.lower_bound(begin.key());
        for (iterator tmp(tree_.lower_bound(begin.key())); tmp != begin; ++tmp) {
            ++checker_begin;
        }
        auto checker_end =
            end == tree_.end() ? checker_.end() : checker_.lower_bound(end.key());
        if (end != tree_.end()) {
            for (iterator tmp(tree_.lower_bound(end.key())); tmp != end; ++tmp) {
                ++checker_end;
            }
        }
        checker_.erase(checker_begin, checker_end);
        tree_.erase(begin, end);
        EXPECT_EQ(tree_.size(), checker_.size());
        EXPECT_EQ(tree_.size(), size - count);
    }